

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O0

bool __thiscall axl::io::Ssl::useCertificateFile(Ssl *this,StringRef *fileName,int fileType)

{
  SSL *ssl;
  bool bVar1;
  int iVar2;
  C *file;
  int in_EDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  int result;
  int result_00;
  
  ssl = (SSL *)in_RDI->m_p;
  file = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_RDI);
  result_00 = (int)((ulong)in_RDI >> 0x20);
  iVar2 = SSL_use_certificate_file(ssl,file,in_EDX);
  bVar1 = complete((Ssl *)CONCAT44(in_EDX,iVar2),result_00);
  return bVar1;
}

Assistant:

bool
Ssl::useCertificateFile(
	const sl::StringRef& fileName,
	int fileType
) {
	ASSERT(m_h);
	int result = ::SSL_use_certificate_file(m_h, fileName.sz(), fileType);
	return complete(result);
}